

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O0

void __thiscall
Catch::clara::TextFlow::Columns::iterator::iterator
          (iterator *this,
          vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>
          *columns)

{
  vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_> *this_00;
  bool bVar1;
  size_type __n;
  iterator local_80;
  reference local_50;
  Column *col;
  const_iterator __end3;
  const_iterator __begin3;
  vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_> *__range3;
  Columns *columns_local;
  iterator *this_local;
  
  this->m_columns = columns;
  std::
  vector<Catch::clara::TextFlow::Column::iterator,_std::allocator<Catch::clara::TextFlow::Column::iterator>_>
  ::vector(&this->m_iterators);
  this->m_activeIterators = 0;
  __n = std::vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>
        ::size(this->m_columns);
  std::
  vector<Catch::clara::TextFlow::Column::iterator,_std::allocator<Catch::clara::TextFlow::Column::iterator>_>
  ::reserve(&this->m_iterators,__n);
  this_00 = this->m_columns;
  __end3 = std::
           vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>::
           begin(this_00);
  col = (Column *)
        std::vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>
        ::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end3,(__normal_iterator<const_Catch::clara::TextFlow::Column_*,_std::vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>_>
                                *)&col);
    if (!bVar1) break;
    local_50 = __gnu_cxx::
               __normal_iterator<const_Catch::clara::TextFlow::Column_*,_std::vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>_>
               ::operator*(&__end3);
    Column::end(&local_80,local_50);
    std::
    vector<Catch::clara::TextFlow::Column::iterator,_std::allocator<Catch::clara::TextFlow::Column::iterator>_>
    ::push_back(&this->m_iterators,&local_80);
    __gnu_cxx::
    __normal_iterator<const_Catch::clara::TextFlow::Column_*,_std::vector<Catch::clara::TextFlow::Column,_std::allocator<Catch::clara::TextFlow::Column>_>_>
    ::operator++(&__end3);
  }
  return;
}

Assistant:

iterator(Columns const& columns, EndTag)
			: m_columns(columns.m_columns),
			m_activeIterators(0) {
			m_iterators.reserve(m_columns.size());

			for (auto const& col : m_columns)
				m_iterators.push_back(col.end());
		}